

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractStringValidator::AbstractStringValidator
          (AbstractStringValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,int finalSet,
          ValidatorType type,MemoryManager *manager)

{
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,type,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__AbstractStringValidator_00405300;
  this->fLength = 0;
  this->fMaxLength = 0x7fffffff;
  this->fMinLength = 0;
  this->fEnumerationInherited = false;
  this->fEnumeration = (RefArrayVectorOf<char16_t> *)0x0;
  return;
}

Assistant:

AbstractStringValidator::AbstractStringValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , const int                           finalSet
                        , const ValidatorType                 type
                        , MemoryManager* const                manager)
:DatatypeValidator(baseValidator, facets, finalSet, type, manager)
,fLength(0)
,fMaxLength(SchemaSymbols::fgINT_MAX_VALUE)
,fMinLength(0)
,fEnumerationInherited(false)
,fEnumeration(0)
{
    // init() is invoked from derived class's ctor instead of from
    // here to allow correct resolution of virutal method, such as
    // assigneAdditionalFacet(), inheritAdditionalFacet().
}